

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EM.cpp
# Opt level: O1

void __thiscall EM::em_alg(EM *this,int cl)

{
  vector<double,std::allocator<double>> *pvVar1;
  iterator iVar2;
  pointer plVar3;
  pointer pvVar4;
  double *pdVar5;
  pointer pvVar6;
  double __x;
  undefined8 uVar7;
  pointer pvVar8;
  ulong uVar9;
  longdouble lVar10;
  longdouble lVar11;
  int iVar12;
  pointer pPVar13;
  int i;
  double *pdVar14;
  pointer pPVar15;
  int iVar16;
  long lVar17;
  pointer pPVar18;
  size_type __n;
  EM *pEVar19;
  int j;
  long lVar20;
  ulong uVar21;
  int k;
  long lVar22;
  bool bVar23;
  longdouble in_ST0;
  longdouble lVar24;
  longdouble lVar25;
  longdouble lVar26;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  l;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  r;
  vector<double,_std::allocator<double>_> W;
  vector<double,_std::allocator<double>_> Wtmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  C;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  X;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Ctmp;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  Rtmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  Y;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  R;
  undefined1 local_298 [32];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_278;
  long local_260;
  pointer local_258;
  vector<double,_std::allocator<double>_> local_250;
  vector<double,_std::allocator<double>_> local_238;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_218;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_200;
  longdouble local_1e4;
  EM *local_1d8;
  vector<long_double,_std::allocator<long_double>_> local_1d0;
  longdouble local_1b8;
  longdouble local_1ac;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_1a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_188;
  size_type local_170;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_168;
  ulong local_150;
  long local_148;
  long local_140;
  pointer local_138;
  double local_130;
  double local_128;
  pointer local_120;
  double local_118;
  double local_110;
  pointer local_108;
  longdouble local_fc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_90;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  local_78;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_188,(long)this->points_nmb,(allocator_type *)&local_218);
  if (0 < this->points_nmb) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      pvVar1 = (vector<double,std::allocator<double>> *)
               ((long)&((local_188.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
      pdVar14 = (double *)
                ((long)&((this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>.
                         _M_impl.super__Vector_impl_data._M_start)->x + lVar17);
      iVar2._M_current =
           *(double **)
            ((long)&((local_188.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + lVar17);
      if (iVar2._M_current ==
          *(double **)
           ((long)&((local_188.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage + lVar17)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (pvVar1,iVar2,pdVar14);
      }
      else {
        *iVar2._M_current = *pdVar14;
        *(double **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      pvVar1 = (vector<double,std::allocator<double>> *)
               ((long)&((local_188.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
      pdVar14 = (double *)
                ((long)&((this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>.
                         _M_impl.super__Vector_impl_data._M_start)->y + lVar17);
      iVar2._M_current =
           *(double **)
            ((long)&((local_188.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + lVar17);
      if (iVar2._M_current ==
          *(double **)
           ((long)&((local_188.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage + lVar17)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (pvVar1,iVar2,pdVar14);
      }
      else {
        *iVar2._M_current = *pdVar14;
        *(double **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar20 < this->points_nmb);
  }
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_218.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_218.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<double,_std::allocator<double>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_218.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<double,_std::allocator<double>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_218.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<double,_std::allocator<double>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._24_8_ = (pointer)(ulong)(uint)cl;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_218.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < cl) {
    iVar16 = 0;
    do {
      lVar17 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::resize
                  (local_218.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar17,local_298._24_8_);
        uVar7 = local_298._24_8_;
        pPVar13 = (pointer)0x0;
        do {
          iVar12 = rand();
          local_218.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar17].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)pPVar13] = (double)(iVar12 % 1000) / 1000.0;
          pPVar13 = (pointer)((long)&pPVar13->eps + 1);
        } while ((pointer)uVar7 != pPVar13);
        bVar23 = lVar17 == 0;
        lVar17 = lVar17 + 1;
      } while (bVar23);
      iVar16 = iVar16 + 1;
    } while (iVar16 != cl);
  }
  local_170 = (size_type)cl;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&local_168,local_170,(allocator_type *)&local_250);
  local_1d8 = this;
  if (0 < cl) {
    lVar17 = local_298._24_8_ * 0x18;
    lVar20 = 0;
    do {
      pvVar8 = local_168.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_200.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
      local_200.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_200;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_250,__l,(allocator_type *)&local_1d0);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)((long)&(pvVar8->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar20),&local_250);
      if ((pointer)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar8 = local_168.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_200.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_200.
      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3ff0000000000000;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_200;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_250,__l_00,(allocator_type *)&local_1d0);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)((long)&(pvVar8->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar20),&local_250);
      this = local_1d8;
      if ((pointer)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar20 = lVar20 + 0x18;
    } while (lVar17 != lVar20);
  }
  __n = local_170;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_250,local_170,(allocator_type *)&local_200);
  uVar7 = local_298._24_8_;
  if (0 < cl) {
    pPVar13 = (pointer)0x0;
    do {
      (&(((vector<Point,_std::allocator<Point>_> *)
         local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start)->super__Vector_base<Point,_std::allocator<Point>_>).
        _M_impl.super__Vector_impl_data._M_start)[(long)pPVar13] = (pointer)(1.0 / (double)cl);
      pPVar13 = (pointer)((long)&pPVar13->eps + 1);
    } while ((pointer)local_298._24_8_ != pPVar13);
  }
  iVar16 = this->points_nmb;
  local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _0_10_ = (BADTYPE)0;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            (&local_1d0,__n,(value_type_conflict3 *)&local_238,(allocator_type *)&local_1a0);
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::vector(&local_200,(long)iVar16,&local_1d0,(allocator_type *)local_298);
  if (local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_148 = uVar7 * 8;
  local_140 = uVar7 * 0x18;
  uVar21 = 0;
  lVar24 = (longdouble)2.1;
  do {
    local_1a0.
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lVar26 = in_ST5;
    local_fc = lVar24;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_238,__n,(value_type_conflict1 *)&local_1a0,(allocator_type *)local_298);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&local_1d0,2,&local_238,(allocator_type *)&local_278);
    if ((pointer)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_1a0.
    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_238,__n,(value_type_conflict1 *)&local_1a0,(allocator_type *)local_298);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector(&local_1a0,__n,(allocator_type *)local_298);
    local_150 = uVar21;
    if (0 < cl) {
      lVar17 = 0;
      do {
        pvVar8 = local_1a0.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_278.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)&local_278;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_298,__l_01,
                   (allocator_type *)&local_258);
        std::
        vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
        ::emplace_back<std::vector<double,std::allocator<double>>>
                  ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                    *)((long)&(pvVar8->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar17),
                   (vector<double,_std::allocator<double>_> *)local_298);
        if ((pointer)local_298._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ - local_298._0_8_);
        }
        pvVar8 = local_1a0.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_278.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __l_02._M_len = 2;
        __l_02._M_array = (iterator)&local_278;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_298,__l_02,
                   (allocator_type *)&local_258);
        std::
        vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
        ::emplace_back<std::vector<double,std::allocator<double>>>
                  ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                    *)((long)&(pvVar8->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar17),
                   (vector<double,_std::allocator<double>_> *)local_298);
        if ((pointer)local_298._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ - local_298._0_8_);
        }
        lVar17 = lVar17 + 0x18;
      } while (local_140 != lVar17);
    }
    local_1b8 = (longdouble)0;
    pPVar13 = (pointer)local_298._24_8_;
    if (0 < this->points_nmb) {
      local_260 = 0;
      local_1b8 = (longdouble)0;
      lVar24 = in_ST0;
      lVar25 = in_ST1;
      lVar10 = in_ST2;
      lVar11 = in_ST3;
      do {
        in_ST3 = in_ST4;
        in_ST2 = lVar11;
        in_ST1 = lVar10;
        in_ST0 = lVar25;
        lVar17 = local_260;
        local_1ac = (longdouble)0;
        if (0 < cl) {
          pPVar18 = (pointer)0x0;
          local_1ac = (longdouble)0;
          do {
            local_298._0_8_ = (pointer)0x0;
            local_298._8_8_ = (pointer)0x0;
            local_298._16_8_ = (pointer)0x0;
            local_298._0_8_ = operator_new(0x30);
            local_298._8_8_ = local_298._0_8_ + 0x30;
            (((pointer)(local_298._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            (((pointer)(local_298._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            (((pointer)local_298._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (((pointer)(local_298._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((pointer)local_298._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (((pointer)local_298._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar20 = 0;
            lVar22 = 0;
            lVar25 = lVar24;
            lVar24 = in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST5;
            in_ST5 = lVar26;
            local_298._16_8_ = local_298._8_8_;
            do {
              local_278.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(local_188.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar17].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar22] -
                            *(double *)
                             (*(long *)((long)&((local_218.
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data._M_start + lVar20) +
                             (long)pPVar18 * 8));
              iVar2._M_current =
                   *(double **)
                    ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                            super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar20);
              if (iVar2._M_current ==
                  *(double **)
                   ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                           super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar20)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)
                           ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                                   super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar20),iVar2,
                           (double *)&local_278);
              }
              else {
                *iVar2._M_current =
                     (double)local_278.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(double **)
                 ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                         super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                         super__Vector_impl_data._M_finish + lVar20) = iVar2._M_current + 1;
              }
              lVar22 = lVar22 + 1;
              lVar20 = lVar20 + 0x18;
            } while (lVar22 == 1);
            pEVar19 = (EM *)local_298;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_a8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)pEVar19);
            matrix_transporation(&local_f0,pEVar19,&local_a8);
            pEVar19 = (EM *)(local_168.
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)pPVar18);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_d8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)pEVar19);
            matrix_reversal(&local_c0,pEVar19,&local_d8);
            matrix_composition(&local_90,pEVar19,&local_f0,&local_c0);
            pEVar19 = (EM *)local_298;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&stack0xffffffffffffffb8,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)pEVar19);
            matrix_composition(&local_278,pEVar19,&local_90,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&stack0xffffffffffffffb8);
            local_1e4 = (longdouble)
                        *((local_278.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_278);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&stack0xffffffffffffffb8);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_90);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_c0);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_d8);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_f0);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_a8);
            local_138 = (&(((vector<Point,_std::allocator<Point>_> *)
                           local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start)->
                          super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                          super__Vector_impl_data._M_start)[(long)pPVar18];
            expl();
            pEVar19 = (EM *)&stack0xffffffffffffffa0;
            local_1e4 = lVar25;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&stack0xffffffffffffffa0,
                     local_168.
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)pPVar18);
            local_108 = local_138;
            local_1e4 = (local_1e4 * (longdouble)(double)local_138) / (longdouble)2.5066282731988805
            ;
            __x = determinat(pEVar19,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      *)&stack0xffffffffffffffa0);
            if (__x < 0.0) {
              local_110 = sqrt(__x);
            }
            else {
              local_110 = SQRT(__x);
            }
            lVar20 = local_260;
            local_200.
            super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_260].
            super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
            super__Vector_impl_data._M_start[(long)pPVar18] = local_1e4 / (longdouble)local_110;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&stack0xffffffffffffffa0);
            local_1ac = local_1ac +
                        local_200.
                        super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar20].
                        super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)pPVar18];
            lVar26 = in_ST5;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_298);
            pPVar18 = (pointer)((long)&pPVar18->eps + 1);
            pPVar13 = (pointer)local_298._24_8_;
          } while (pPVar18 != (pointer)local_298._24_8_);
        }
        in_ST4 = in_ST5;
        in_ST5 = lVar26;
        if (0 < cl) {
          plVar3 = local_200.
                   super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_260].
                   super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar14 = local_188.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_260].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar17 = *(long *)local_1d0.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          lVar20 = *(long *)((long)local_1d0.
                                   super__Vector_base<long_double,_std::allocator<long_double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 0x18);
          lVar22 = 0;
          do {
            lVar26 = *(longdouble *)((long)plVar3 + lVar22 * 2) / local_1ac;
            *(longdouble *)((long)plVar3 + lVar22 * 2) = lVar26;
            *(double *)
             ((long)&(((_Vector_base<Cluster,_std::allocator<Cluster>_> *)
                      local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data._M_start +
             lVar22) = (double)(lVar26 + (longdouble)
                                         *(double *)
                                          ((long)&(((_Vector_base<Cluster,_std::allocator<Cluster>_>
                                                     *)local_238.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_impl).super__Vector_impl_data._M_start + lVar22
                                          ));
            *(double *)(lVar17 + lVar22) =
                 (double)(lVar26 * (longdouble)*pdVar14 + (longdouble)*(double *)(lVar17 + lVar22));
            *(double *)(lVar20 + lVar22) =
                 (double)(lVar26 * (longdouble)pdVar14[1] + (longdouble)*(double *)(lVar20 + lVar22)
                         );
            lVar22 = lVar22 + 8;
            in_ST4 = in_ST3;
            in_ST5 = in_ST3;
          } while (local_148 != lVar22);
        }
        logl();
        local_1b8 = local_1b8 + lVar24;
        local_260 = local_260 + 1;
        this = local_1d8;
        lVar24 = in_ST0;
        lVar25 = in_ST1;
        lVar10 = in_ST2;
        lVar11 = in_ST3;
        lVar26 = in_ST5;
      } while (local_260 < local_1d8->points_nmb);
    }
    if (0 < cl) {
      pPVar18 = (pointer)0x0;
      do {
        lVar17 = 0;
        do {
          *(double *)
           (*(long *)((long)&((local_218.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar17) + (long)pPVar18 * 8) =
               *(double *)
                (*(long *)((long)local_1d0.
                                 super__Vector_base<long_double,_std::allocator<long_double>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar17) +
                (long)pPVar18 * 8) /
               (double)(&(((_Vector_base<Cluster,_std::allocator<Cluster>_> *)
                          local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                         _M_start)[(long)pPVar18];
          lVar17 = lVar17 + 0x18;
        } while (lVar17 == 0x18);
        iVar16 = this->points_nmb;
        if (0 < iVar16) {
          lVar17 = 0;
          do {
            local_298._0_8_ = (pointer)0x0;
            local_298._8_8_ = (pointer)0x0;
            local_298._16_8_ = (pointer)0x0;
            local_298._0_8_ = operator_new(0x30);
            local_298._8_8_ = local_298._0_8_ + 0x30;
            (((pointer)(local_298._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            (((pointer)(local_298._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            (((pointer)local_298._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (((pointer)(local_298._0_8_ + 0x18))->points).
            super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((pointer)local_298._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (((pointer)local_298._0_8_)->points).super__Vector_base<Point,_std::allocator<Point>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_298._16_8_ = local_298._8_8_;
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((pointer)local_278.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2);
            ((pointer)
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)[1].x = 0.0;
            ((pointer)
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)[1].y = 0.0;
            ((pointer)
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->y = 0.0;
            (((_Vector_base<double,_std::allocator<double>_> *)
             &((pointer)
              local_278.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)[1].eps)->_M_impl).super__Vector_impl_data.
            _M_start = (pointer)0x0;
            (((_Vector_base<double,_std::allocator<double>_> *)
             &((pointer)
              local_278.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->eps)->_M_impl).super__Vector_impl_data.
            _M_start = (pointer)0x0;
            ((pointer)
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->x = 0.0;
            lVar22 = 0;
            lVar20 = 0;
            local_278.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_278.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            do {
              local_118 = *(double *)
                           ((long)local_188.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar22) -
                          *(double *)
                           (*(long *)((long)&((local_218.
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data._M_start + lVar20) +
                           (long)pPVar18 * 8);
              local_258 = (pointer)(double)(local_200.
                                            super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                            super__Vector_base<long_double,_std::allocator<long_double>_>
                                            ._M_impl.super__Vector_impl_data._M_start[(long)pPVar18]
                                           * (longdouble)local_118);
              iVar2._M_current =
                   *(double **)
                    ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                            super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar20);
              local_120 = local_258;
              if (iVar2._M_current ==
                  *(double **)
                   ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                           super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar20)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)
                           ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                                   super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar20),iVar2,
                           (double *)&local_258);
              }
              else {
                *iVar2._M_current = (double)local_258;
                *(double **)
                 ((long)&(((vector<Point,_std::allocator<Point>_> *)local_298._0_8_)->
                         super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                         super__Vector_impl_data._M_finish + lVar20) = iVar2._M_current + 1;
              }
              local_258 = (pointer)(*(double *)
                                     ((long)local_188.
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar22) -
                                   *(double *)
                                    (*(long *)((long)&((local_218.
                                                                                                                
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                              lVar20) + (long)pPVar18 * 8));
              iVar2._M_current =
                   *(double **)
                    ((long)((long)local_278.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8) + lVar20);
              if (iVar2._M_current ==
                  *(double **)
                   ((long)((long)local_278.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x10) + lVar20)) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          ((vector<double,_std::allocator<double>_> *)
                           ((long)&((local_278.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar20),iVar2,
                           (double *)&local_258);
              }
              else {
                *iVar2._M_current = (double)local_258;
                *(double **)
                 ((long)((long)local_278.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8) + lVar20) =
                     iVar2._M_current + 1;
              }
              lVar20 = lVar20 + 0x18;
              lVar22 = lVar22 + 8;
            } while (lVar20 == 0x18);
            pdVar14 = local_188.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar17].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_128 = *pdVar14 -
                        ((local_218.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[(long)pPVar18];
            local_128 = local_128 * local_128;
            lVar24 = local_200.
                     super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17].
                     super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)pPVar18];
            pvVar4 = local_1a0.
                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pPVar18].
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar5 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            *pdVar5 = (double)(lVar24 * (longdouble)local_128 + (longdouble)*pdVar5);
            local_130 = pdVar14[1] -
                        local_218.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)pPVar18];
            local_130 = local_130 * local_130;
            lVar20 = *(long *)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data;
            *(double *)(lVar20 + 8) =
                 (double)(lVar24 * (longdouble)local_130 + (longdouble)*(double *)(lVar20 + 8));
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_278);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)local_298);
            lVar17 = lVar17 + 1;
            iVar16 = local_1d8->points_nmb;
            this = local_1d8;
            pPVar13 = (pointer)local_298._24_8_;
          } while (lVar17 < iVar16);
        }
        pPVar15 = (pointer)0x0;
        do {
          (&(((vector<Point,_std::allocator<Point>_> *)
             local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start)->super__Vector_base<Point,_std::allocator<Point>_>).
            _M_impl.super__Vector_impl_data._M_start)[(long)pPVar15] =
               (pointer)((double)(&(((_Vector_base<Cluster,_std::allocator<Cluster>_> *)
                                    local_238.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                   super__Vector_impl_data._M_start)[(long)pPVar15] / (double)iVar16
                        );
          pPVar15 = (pointer)((long)&pPVar15->eps + 1);
        } while (pPVar13 != pPVar15);
        pvVar4 = local_1a0.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pPVar18].
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar6 = local_168.
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pPVar18].
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start =
             *(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start /
             (double)(&(((_Vector_base<Cluster,_std::allocator<Cluster>_> *)
                        local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data._M_start
                     )[(long)pPVar18];
        *(double *)
         (*(long *)&pvVar6[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 8) =
             *(double *)
              (*(long *)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) /
             (double)(&(((_Vector_base<Cluster,_std::allocator<Cluster>_> *)
                        local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data._M_start
                     )[(long)pPVar18];
        pPVar18 = (pointer)((long)&pPVar18->eps + 1);
      } while (pPVar18 != pPVar13);
    }
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::vector(&local_78,&local_200);
    make_clusters(this,&local_78,cl);
    uVar9 = local_150;
    __n = local_170;
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::~vector(&local_1a0);
    if ((pointer)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_1d0);
  } while (((longdouble)0.1 <= ABS(local_1b8 - local_fc)) &&
          (uVar21 = (ulong)((uint)uVar9 + 1), lVar24 = local_1b8, in_ST5 = in_ST4,
          (uint)uVar9 < 0x31));
  std::
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  ::~vector(&local_200);
  if ((pointer)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_218);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_188);
  return;
}

Assistant:

void EM:: em_alg(int cl) {
    int dim=2;
    double e=0.1;
    int Q=0;
    vector<vector<double>> Y(points_nmb);//xi
    for(int i=0;i<points_nmb;i++)//point_nmb*dim
    {
        Y[i].push_back(f.all_points[i].x);
        Y[i].push_back(f.all_points[i].y);
    }


    vector<vector<double>> C(dim);//mathematical expectation

    for(int i=0;i<cl;i++) {
        for (int i = 0; i < 2; i++) {
            C[i].resize(cl);

            for (int j = 0; j < cl; j++) {
                C[i][j] = (double)(rand() % 1000)/1000;

            }
        }
    }


    vector<vector<vector<double>>> R(cl);//sigma covariation matrix

    for(int i=0;i<cl;i++) {
        R[i].push_back({1,0});
        R[i].push_back({0,1});

    }


    vector<double> W(cl);

    for(int i=0;i<cl;i++) {
        W[i] = (double) 1 / cl;
    }


    vector<vector<long double>>X(points_nmb, vector<long double>(cl, 0));



    long double llh=0,llh2=e+2;
    long double sumpi=0;

    //start cycle
    while(fabs(llh2-llh)>=e and Q<50)
    {
        vector <vector <double> > Ctmp (dim, vector<double>(cl, 0));

        vector <double> Wtmp(cl, 0);

        Q++;
        llh=llh2;
        vector<vector<vector<double>>> Rtmp(cl);

        for(int i=0;i<cl;i++) {
            Rtmp[i].push_back({0,0});
            Rtmp[i].push_back({0,0});

        }

        llh2=0;
        for(int i=0;i<points_nmb;i++)
        {

            sumpi=0;
            for(int j=0;j<cl;j++)
            {
                vector<vector<double>> l(dim);

                for(int k=0;k<dim;k++)
                {
                    l[k].push_back(Y[i][k]-C[k][j]);

                }
                double sigma=matrix_composition(matrix_composition(matrix_transporation(l),matrix_reversal(R[j])),l)[0][0];//scalar product- mahalanobis distination
                X[i][j] = (long double)W[j] * expl((long double)-sigma/2)/sqrt(2*PI)/sqrt(determinat(R[j]));
                sumpi+=X[i][j];//found p(x)

            }
            for(int j=0;j<cl;j++) {
                X[i][j]/= sumpi;
                Wtmp[j]+=X[i][j];
                Ctmp[0][j]+= Y[i][0] * X[i][j];
                Ctmp[1][j]+=Y[i][1] * X[i][j];
            }

            llh2=llh2+log(sumpi);

        }

        for(int j=0;j<cl;j++)
        {
            for(int k=0;k<dim;k++)
            {
                C[k][j]=Ctmp[k][j]/Wtmp[j];
            }


            for(int i=0;i<points_nmb;i++)
            {
                vector<vector<double>> l(dim);
                vector<vector<double>> r(dim);
                for(int k=0;k<dim;k++)
                {
                    l[k].push_back((Y[i][k]-C[k][j])*X[i][j]);
                    r[k].push_back((Y[i][k]-C[k][j]));
                }

                Rtmp[j][0][0]+=(Y[i][0]-C[0][j])*(Y[i][0]-C[0][j])*X[i][j];
                Rtmp[j][1][1]+=(Y[i][1]-C[1][j])*(Y[i][1]-C[1][j])*X[i][j];
            }
            for (int i = 0; i < cl; i++) {
                W[i] = Wtmp[i]/points_nmb;
            }
            R[j][0][0] = Rtmp[j][0][0]/Wtmp[j];
            R[j][1][1] = Rtmp[j][1][1]/Wtmp[j];

        }
        make_clusters(X,cl);


    }



}